

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_accounting.c
# Opt level: O0

int mm_acct_save_TCASHST
              (void *db,mm_telco_t *telco,char *terminal_id,cashbox_status_univ_t *cashbox_status)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char local_288 [8];
  char timestamp_str [20];
  char acStack_268 [8];
  char received_time_str [16];
  char sql [512];
  cashbox_status_univ_t *cashbox_status_local;
  char *terminal_id_local;
  mm_telco_t *telco_local;
  void *db_local;
  
  memset(received_time_str + 8,0,0x200);
  acStack_268[0] = '\0';
  acStack_268[1] = '\0';
  acStack_268[2] = '\0';
  acStack_268[3] = '\0';
  acStack_268[4] = '\0';
  acStack_268[5] = '\0';
  acStack_268[6] = '\0';
  acStack_268[7] = '\0';
  received_time_str[0] = '\0';
  received_time_str[1] = '\0';
  received_time_str[2] = '\0';
  received_time_str[3] = '\0';
  received_time_str[4] = '\0';
  received_time_str[5] = '\0';
  received_time_str[6] = '\0';
  received_time_str[7] = '\0';
  pcVar2 = timestamp_to_string(cashbox_status->timestamp,local_288,0x14);
  printf("\t\tCashbox status: %s: Total: $%6.2f (%3d%% full): CA N:%d D:%d Q:%d $:%d - US N:%d D:%d Q:%d $:%d\n"
         ,SUB84((double)((float)cashbox_status->currency_value / 100.0),0),pcVar2,
         (ulong)cashbox_status->percent_full,(ulong)cashbox_status->coin_count[0],
         (ulong)cashbox_status->coin_count[1],(ulong)cashbox_status->coin_count[2],
         (uint)cashbox_status->coin_count[3],(uint)cashbox_status->coin_count[4],
         (uint)cashbox_status->coin_count[5],(uint)cashbox_status->coin_count[6],
         (uint)cashbox_status->coin_count[7]);
  pcVar2 = received_time_to_db_string(acStack_268,0x10);
  pcVar3 = timestamp_to_db_string(cashbox_status->timestamp,local_288,0x14);
  snprintf(received_time_str + 8,0x200,
           "REPLACE INTO TCASHST ( TERMINAL_ID,RECEIVED_DATE,RECEIVED_TIME,START_DATE,START_TIME, CASH_BOX_STATUS, PERCENT_FULL, CURRENCY_VALUE,NUMBER_OF_CDN_NICKELS, NUMBER_OF_CDN_DIMES, NUMBER_OF_CDN_QUARTERS, NUMBER_OF_CDN_DOLLARS,NUMBER_OF_US_NICKELS,  NUMBER_OF_US_DIMES,  NUMBER_OF_US_QUARTERS,  NUMBER_OF_US_DOLLARS,TELCO_ID, REGION_CODE) VALUES ( \"%s\",%s,%s,%d,%d,\"%6.2f\", %d, %d, %d, %d, %d, %d, %d, %d, \"%c%c\",\"%c%c%c\");"
           ,SUB84((double)((float)cashbox_status->currency_value / 100.0),0),terminal_id,pcVar2,
           pcVar3,(uint)cashbox_status->percent_full,(uint)cashbox_status->status,
           (uint)cashbox_status->coin_count[0],(uint)cashbox_status->coin_count[1],
           (uint)cashbox_status->coin_count[2],(uint)cashbox_status->coin_count[3],
           (uint)cashbox_status->coin_count[4],(uint)cashbox_status->coin_count[5],
           (uint)cashbox_status->coin_count[6],(uint)cashbox_status->coin_count[7],
           (uint)telco->id[0],(uint)telco->id[1],(uint)telco->region_code[0],
           (uint)telco->region_code[1],(uint)telco->region_code[2]);
  iVar1 = mm_sql_exec(db,received_time_str + 8);
  return iVar1;
}

Assistant:

int mm_acct_save_TCASHST(void *db, mm_telco_t *telco, char* terminal_id, cashbox_status_univ_t* cashbox_status) {
    char sql[512] = { 0 };
    char received_time_str[16] = { 0 };
    char timestamp_str[20];

    printf("\t\tCashbox status: %s: Total: $%6.2f (%3d%% full): CA N:%d D:%d Q:%d $:%d - US N:%d D:%d Q:%d $:%d\n",
        timestamp_to_string(cashbox_status->timestamp, timestamp_str, sizeof(timestamp_str)),
        (float)cashbox_status->currency_value / 100,
        cashbox_status->percent_full,
        cashbox_status->coin_count[COIN_COUNT_CA_NICKELS],
        cashbox_status->coin_count[COIN_COUNT_CA_DIMES],
        cashbox_status->coin_count[COIN_COUNT_CA_QUARTERS],
        cashbox_status->coin_count[COIN_COUNT_CA_DOLLARS],
        cashbox_status->coin_count[COIN_COUNT_US_NICKELS],
        cashbox_status->coin_count[COIN_COUNT_US_DIMES],
        cashbox_status->coin_count[COIN_COUNT_US_QUARTERS],
        cashbox_status->coin_count[COIN_COUNT_US_DOLLARS]);

    snprintf(sql, sizeof(sql), "REPLACE INTO TCASHST ( "
        "TERMINAL_ID,RECEIVED_DATE,RECEIVED_TIME,START_DATE,START_TIME, CASH_BOX_STATUS, PERCENT_FULL, CURRENCY_VALUE,"
        "NUMBER_OF_CDN_NICKELS, NUMBER_OF_CDN_DIMES, NUMBER_OF_CDN_QUARTERS, NUMBER_OF_CDN_DOLLARS,"
        "NUMBER_OF_US_NICKELS,  NUMBER_OF_US_DIMES,  NUMBER_OF_US_QUARTERS,  NUMBER_OF_US_DOLLARS,"
        "TELCO_ID, REGION_CODE"
        ") VALUES ( "
        "\"%s\",%s,%s,%d,%d,\"%6.2f\", "
        "%d, %d, %d, %d, %d, %d, %d, %d, " TELCO_ID_REGION_CODE ");",
        terminal_id,
        received_time_to_db_string(received_time_str, sizeof(received_time_str)),
        timestamp_to_db_string(cashbox_status->timestamp, timestamp_str, sizeof(timestamp_str)),
        cashbox_status->percent_full,
        cashbox_status->status,
        (float)cashbox_status->currency_value / 100,
        cashbox_status->coin_count[COIN_COUNT_CA_NICKELS],
        cashbox_status->coin_count[COIN_COUNT_CA_DIMES],
        cashbox_status->coin_count[COIN_COUNT_CA_QUARTERS],
        cashbox_status->coin_count[COIN_COUNT_CA_DOLLARS],
        cashbox_status->coin_count[COIN_COUNT_US_NICKELS],
        cashbox_status->coin_count[COIN_COUNT_US_DIMES],
        cashbox_status->coin_count[COIN_COUNT_US_QUARTERS],
        cashbox_status->coin_count[COIN_COUNT_US_DOLLARS],
        telco->id[0], telco->id[1],
        telco->region_code[0], telco->region_code[1], telco->region_code[2]);

    return mm_sql_exec(db, sql);
}